

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstanceSymbols.cpp
# Opt level: O1

void __thiscall
slang::ast::CheckerMemberVisitor::handle
          (CheckerMemberVisitor *this,HierarchicalValueExpression *expr)

{
  Symbol *pSVar1;
  bool bVar2;
  Scope *scope;
  CheckerInstanceBodySymbol *pCVar3;
  Diagnostic *this_00;
  bool bVar4;
  CheckerInstanceBodySymbol *pCVar5;
  CheckerInstanceBodySymbol *pCVar6;
  
  pCVar3 = (CheckerInstanceBodySymbol *)
           (((expr->super_ValueExpressionBase).symbol)->super_Symbol).parentScope;
  bVar4 = false;
  pCVar6 = pCVar3;
  do {
    if (pCVar6 == (CheckerInstanceBodySymbol *)0x0) break;
    pSVar1 = (Symbol *)(pCVar6->super_Symbol).name._M_len;
    if (pSVar1->kind == StatementBlock) {
      if (*(int *)&pSVar1[1].originatingSyntax != 0) {
        bVar4 = true;
        goto LAB_0024c31d;
      }
      pCVar6 = (CheckerInstanceBodySymbol *)pSVar1->parentScope;
      bVar2 = true;
    }
    else {
LAB_0024c31d:
      bVar2 = false;
    }
  } while (bVar2);
  if (!bVar4) {
    return;
  }
  pCVar6 = this->body;
  pCVar5 = pCVar6;
  if (pCVar6 != (CheckerInstanceBodySymbol *)0x0) {
    pCVar5 = (CheckerInstanceBodySymbol *)&pCVar6->super_Scope;
  }
  while (pCVar3 != (CheckerInstanceBodySymbol *)0x0) {
    if (pCVar3 == pCVar5) {
      return;
    }
    pSVar1 = (Symbol *)(pCVar3->super_Symbol).name._M_len;
    if (pSVar1->kind == InstanceBody) break;
    pCVar3 = (CheckerInstanceBodySymbol *)pSVar1->parentScope;
  }
  this_00 = Scope::addDiag(&pCVar6->super_Scope,(DiagCode)0x3b0007,
                           (expr->super_ValueExpressionBase).super_Expression.sourceRange);
  Diagnostic::addNote(this_00,(DiagCode)0x50001,
                      (((expr->super_ValueExpressionBase).symbol)->super_Symbol).location);
  return;
}

Assistant:

void handle(const HierarchicalValueExpression& expr) {
        bool inForkJoin = false;
        auto scope = expr.symbol.getParentScope();
        while (scope) {
            auto& sym = scope->asSymbol();
            if (sym.kind != SymbolKind::StatementBlock)
                break;

            if (sym.as<StatementBlockSymbol>().blockKind != StatementBlockKind::Sequential) {
                inForkJoin = true;
                break;
            }

            scope = sym.getParentScope();
        }

        if (inForkJoin && !isFromChecker(expr.symbol)) {
            auto& diag = body.addDiag(diag::CheckerForkJoinRef, expr.sourceRange);
            diag.addNote(diag::NoteDeclarationHere, expr.symbol.location);
            return;
        }

        visitDefault(expr);
    }